

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.cpp
# Opt level: O0

string * __thiscall
OutputIterations::get_current_iteration_string_abi_cxx11_(OutputIterations *this)

{
  string *in_RDI;
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char str_buffer [100];
  double value;
  double ACCURACY;
  allocator local_89;
  char local_88 [104];
  double local_20;
  undefined8 local_18;
  
  local_18 = 0x4059000000000000;
  dVar2 = get_current_iteration_time((OutputIterations *)0x17d0f3);
  dVar2 = ((dVar2 * 0.5) / 3.141592653589793) * 100.0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar2;
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar1._8_8_ = 0x3fdfffffffffffff;
  auVar1._0_8_ = 0x3fdfffffffffffff;
  auVar1 = vpternlogq_avx512vl(auVar1,auVar3,auVar6,0xf8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar2 + auVar1._0_8_;
  auVar1 = vroundsd_avx(auVar3,auVar5,0xb);
  auVar4._0_4_ = (int)auVar1._0_8_;
  auVar4._4_4_ = (int)auVar1._8_8_;
  auVar4._8_8_ = 0;
  auVar1 = vcvtdq2pd_avx(auVar4);
  local_20 = auVar1._0_8_ / 100.0;
  sprintf(local_88,"%g",local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_88,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return in_RDI;
}

Assistant:

std::string OutputIterations::get_current_iteration_string() const {
    const double ACCURACY = 100.;

    double value = static_cast<int>(round(get_current_iteration_time() / 2 / PI * ACCURACY)) / ACCURACY;

    char str_buffer[100];
    sprintf(str_buffer, "%g", value);
    return std::string(str_buffer);
}